

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadTable
          (BinaryReader *this,Type *out_elem_type,Limits *out_elem_limits)

{
  uint uVar1;
  Result RVar2;
  Enum EVar3;
  uint32_t flags;
  uint32_t max;
  uint32_t initial;
  Type local_2c;
  uint32_t local_28;
  uint local_24;
  
  local_2c.enum_ = Any;
  RVar2 = ReadS32Leb128(this,(uint32_t *)&local_2c,"table elem type");
  if (RVar2.enum_ != Error) {
    out_elem_type->enum_ = (Enum)local_2c;
    if (((uint)(local_2c.enum_ + ~(Func|I32U)) < 0x1b) &&
       ((0x40001c1U >> (local_2c.enum_ + ~(Func|I32U) & 0x1fU) & 1) != 0)) {
      local_28 = 0;
      RVar2 = ReadU32Leb128(this,(uint32_t *)&local_2c,"table flags");
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      RVar2 = ReadU32Leb128(this,&local_24,"table initial elem count");
      if (RVar2.enum_ == Error) {
        return (Result)Error;
      }
      if ((local_2c.enum_ & Hostref) != Any) {
        PrintError(this,"tables may not be shared");
        return (Result)Error;
      }
      EVar3 = local_2c.enum_ & ~I64;
      uVar1 = 0;
      if ((EVar3 != Any) &&
         (RVar2 = ReadU32Leb128(this,&local_28,"table max elem count"), uVar1 = local_28,
         RVar2.enum_ == Error)) {
        return (Result)Error;
      }
      out_elem_limits->has_max = SUB41(EVar3,0);
      out_elem_limits->initial = (ulong)local_24;
      out_elem_limits->max = (ulong)uVar1;
      return (Result)Ok;
    }
    PrintError(this,"table elem type must be a reference type");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadTable(Type* out_elem_type, Limits* out_elem_limits) {
  CHECK_RESULT(ReadType(out_elem_type, "table elem type"));
  ERROR_UNLESS(out_elem_type->IsRef(),
               "table elem type must be a reference type");

  uint32_t flags;
  uint32_t initial;
  uint32_t max = 0;
  CHECK_RESULT(ReadU32Leb128(&flags, "table flags"));
  CHECK_RESULT(ReadU32Leb128(&initial, "table initial elem count"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  ERROR_IF(is_shared, "tables may not be shared");
  if (has_max) {
    CHECK_RESULT(ReadU32Leb128(&max, "table max elem count"));
  }

  out_elem_limits->has_max = has_max;
  out_elem_limits->initial = initial;
  out_elem_limits->max = max;
  return Result::Ok;
}